

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

errr finish_parse_eff(parser *p)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char **ppcVar7;
  angband_constants *paVar8;
  blow_effect *pbVar9;
  void *pvVar10;
  undefined8 *p_00;
  uint16_t uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  z_info->blow_effects_max = 0;
  pvVar10 = parser_priv(p);
  paVar8 = z_info;
  uVar11 = z_info->blow_effects_max;
  for (; pvVar10 != (void *)0x0; pvVar10 = *(void **)((long)pvVar10 + 0x30)) {
    uVar11 = uVar11 + 1;
    paVar8->blow_effects_max = uVar11;
  }
  lVar14 = (ulong)uVar11 * 0x38;
  blow_effects = (blow_effect *)mem_zalloc(lVar14 + 0x38);
  p_00 = (undefined8 *)parser_priv(p);
  uVar13 = (ulong)uVar11;
  while (pbVar9 = blow_effects, p_00 != (undefined8 *)0x0) {
    ppcVar7 = &blow_effects->name;
    *(undefined8 *)((long)blow_effects + lVar14 + -8) = p_00[6];
    uVar2 = *p_00;
    uVar3 = p_00[1];
    uVar4 = p_00[2];
    uVar5 = p_00[3];
    uVar6 = p_00[5];
    puVar1 = (undefined8 *)((long)pbVar9 + lVar14 + -0x18);
    *puVar1 = p_00[4];
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)pbVar9 + lVar14 + -0x28);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pbVar9[-1].name + lVar14);
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    puVar1 = (undefined8 *)p_00[6];
    lVar12 = (long)ppcVar7 + lVar14;
    if ((long)(ulong)z_info->blow_effects_max <= (long)uVar13) {
      lVar12 = 0;
    }
    *(long *)((long)pbVar9 + lVar14 + -8) = lVar12;
    mem_free(p_00);
    lVar14 = lVar14 + -0x38;
    p_00 = puVar1;
    uVar13 = uVar13 - 1;
  }
  z_info->blow_effects_max = z_info->blow_effects_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_eff(struct parser *p) {
	struct blow_effect *eff, *next = NULL;
	int count;

	/* Count the entries */
	z_info->blow_effects_max = 0;
	eff = parser_priv(p);
	while (eff) {
		z_info->blow_effects_max++;
		eff = eff->next;
	}

	/* Allocate the direct access list and copy the data to it */
	count = z_info->blow_effects_max - 1;
	blow_effects = mem_zalloc((z_info->blow_effects_max + 1) * sizeof(*eff));
	for (eff = parser_priv(p); eff; eff = next, count--) {
		memcpy(&blow_effects[count], eff, sizeof(*eff));
		next = eff->next;
		if (count < z_info->blow_effects_max - 1)
			blow_effects[count].next = &blow_effects[count + 1];
		else
			blow_effects[count].next = NULL;

		mem_free(eff);
	}
	z_info->blow_effects_max++;

	parser_destroy(p);
	return 0;
}